

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableDrawBorders(ImGuiTable *table)

{
  float *pfVar1;
  ImRect *pIVar2;
  ImVec2 *pIVar3;
  short sVar4;
  ImGuiWindow *pIVar5;
  ImDrawList *draw_list;
  ImVec2 IVar6;
  int iVar7;
  ImU32 IVar8;
  ImGuiTableInstanceData *pIVar9;
  uint uVar10;
  ulong uVar11;
  ImGuiTableColumn *pIVar12;
  bool bVar13;
  uint uVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  ImRect outer_border;
  ImVec2 local_70;
  ImVec2 local_68;
  ImVec2 aIStack_60 [2];
  float local_50;
  float local_4c;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  pIVar5 = table->OuterWindow;
  fVar19 = (pIVar5->ClipRect).Max.y;
  pfVar1 = &(table->OuterRect).Min.y;
  if (fVar19 < *pfVar1 || fVar19 == *pfVar1) {
    return;
  }
  fVar19 = (table->OuterRect).Max.y;
  pfVar1 = &(pIVar5->ClipRect).Min.y;
  if (fVar19 < *pfVar1 || fVar19 == *pfVar1) {
    return;
  }
  pIVar2 = &table->OuterRect;
  fVar19 = (pIVar5->ClipRect).Max.x;
  if (fVar19 < (pIVar2->Min).x || fVar19 == (pIVar2->Min).x) {
    return;
  }
  fVar19 = (table->OuterRect).Max.x;
  if (fVar19 < (pIVar5->ClipRect).Min.x || fVar19 == (pIVar5->ClipRect).Min.x) {
    return;
  }
  draw_list = table->InnerWindow->DrawList;
  ImDrawListSplitter::SetCurrentChannel(table->DrawSplitter,draw_list,0);
  ImDrawList::PushClipRect
            (draw_list,&(table->Bg0ClipRectForDrawCmd).Min,&(table->Bg0ClipRectForDrawCmd).Max,false
            );
  if ((long)table->InstanceCurrent == 0) {
    pIVar9 = &table->InstanceDataFirst;
  }
  else {
    pIVar9 = (table->InstanceDataExtra).Data + (long)table->InstanceCurrent + -1;
  }
  fVar19 = (table->InnerRect).Min.y;
  fVar17 = fVar19;
  if (table->FreezeRowsCount < 1) {
    fVar17 = (table->WorkRect).Min.y;
  }
  fVar17 = fVar17 + table->AngledHeadersHeight;
  uVar14 = -(uint)(fVar17 <= fVar19);
  uVar10 = table->Flags;
  fVar15 = 0.0;
  if ((uVar10 >> 8 & 1) != 0) {
    fVar15 = 1.0;
  }
  fVar15 = (float)(uVar14 & (uint)fVar19 | ~uVar14 & (uint)fVar17) + fVar15;
  fVar19 = (table->InnerRect).Max.y;
  fVar17 = fVar15;
  if ((table->IsUsingHeaders == true) &&
     (fVar16 = (float)table->RowBgColor[(ulong)(table->FreezeRowsCount < 1) * 4 + 0x1a] +
               pIVar9->LastTopHeadersRowHeight, fVar17 = fVar19, fVar16 <= fVar19)) {
    fVar17 = fVar16;
  }
  if (((uVar10 >> 9 & 1) != 0) && (iVar7 = table->ColumnsCount, 0 < iVar7)) {
    uVar11 = 0;
    uStack_44 = 0;
    uStack_40 = 0;
    uStack_3c = 0;
    local_50 = fVar17;
    local_4c = fVar19;
    local_48 = fVar15;
    do {
      if ((table->EnabledMaskByDisplayOrder[uVar11 >> 5 & 0x7ffffff] >> ((uint)uVar11 & 0x1f) & 1)
          != 0) {
        sVar4 = (table->DisplayOrderToIndex).Data[uVar11];
        if (table->ResizedColumn == sVar4) {
          bVar13 = table->InstanceInteracted == table->InstanceCurrent;
        }
        else {
          bVar13 = false;
        }
        pIVar12 = (table->Columns).Data + (int)sVar4;
        fVar16 = pIVar12->MaxX;
        pIVar3 = &(table->InnerClipRect).Max;
        if ((bool)((fVar16 < pIVar3->x || fVar16 == pIVar3->x) | bVar13)) {
          if ((((pIVar12->NextEnabledColumn != -1) || ((pIVar12->Flags & 0x40000020U) == 0)) ||
              ((table->Flags & 0x1e000U) == 0x4000)) && ((pIVar12->ClipRect).Min.x < fVar16)) {
            fVar18 = fVar19;
            if (((table->HoveredColumnBorder != sVar4 && !bVar13) &&
                (uVar11 + 1 != ((long)table->FreezeColumnsCount & 0xffffffffU))) &&
               ((table->Flags & 0x1800) != 0)) {
              fVar18 = fVar17;
            }
            if (fVar15 < fVar18) {
              local_70.y = fVar18;
              local_70.x = fVar16;
              local_68.x = fVar16;
              local_68.y = fVar15;
              IVar8 = TableGetColumnBorderCol(table,(uint)uVar11,(int)sVar4);
              ImDrawList::AddLine(draw_list,&local_68,&local_70,IVar8,1.0);
              iVar7 = table->ColumnsCount;
              fVar19 = local_4c;
              fVar17 = local_50;
              fVar15 = local_48;
            }
          }
        }
      }
      uVar11 = uVar11 + 1;
    } while ((long)uVar11 < (long)iVar7);
    uVar10 = table->Flags;
  }
  if ((uVar10 & 0x500) == 0) goto LAB_001b13d8;
  IVar6 = (table->OuterRect).Max;
  local_68.x = (pIVar2->Min).x;
  local_68.y = (pIVar2->Min).y;
  aIStack_60[0].x = IVar6.x;
  aIStack_60[0].y = IVar6.y;
  IVar8 = table->BorderColorStrong;
  if ((uVar10 & 0x500) == 0x500) {
    local_70.y = aIStack_60[0].y + 1.0;
    local_70.x = aIStack_60[0].x + 1.0;
    ImDrawList::AddRect(draw_list,&local_68,&local_70,IVar8,0.0,0,1.0);
  }
  else {
    if ((uVar10 >> 10 & 1) == 0) {
      if ((uVar10 >> 8 & 1) == 0) goto LAB_001b13d5;
      local_70.y = local_68.y;
      local_70.x = aIStack_60[0].x;
      ImDrawList::AddLine(draw_list,&local_68,&local_70,IVar8,1.0);
      local_70.y = aIStack_60[0].y;
      local_70.x = local_68.x;
    }
    else {
      local_70.y = aIStack_60[0].y;
      local_70.x = local_68.x;
      ImDrawList::AddLine(draw_list,&local_68,&local_70,IVar8,1.0);
      local_70.y = local_68.y;
      local_70.x = aIStack_60[0].x;
    }
    ImDrawList::AddLine(draw_list,&local_70,aIStack_60,IVar8,1.0);
  }
LAB_001b13d5:
  uVar10 = table->Flags;
LAB_001b13d8:
  if ((((char)uVar10 < '\0') && (fVar19 = table->RowPosY2, fVar19 < (table->OuterRect).Max.y)) &&
     (((table->BgClipRect).Min.y <= fVar19 && (fVar19 < (table->BgClipRect).Max.y)))) {
    local_68.x = table->BorderX1;
    local_70.y = fVar19;
    local_70.x = table->BorderX2;
    local_68.y = fVar19;
    ImDrawList::AddLine(draw_list,&local_68,&local_70,table->BorderColorLight,1.0);
  }
  ImDrawList::PopClipRect(draw_list);
  return;
}

Assistant:

void ImGui::TableDrawBorders(ImGuiTable* table)
{
    ImGuiWindow* inner_window = table->InnerWindow;
    if (!table->OuterWindow->ClipRect.Overlaps(table->OuterRect))
        return;

    ImDrawList* inner_drawlist = inner_window->DrawList;
    table->DrawSplitter->SetCurrentChannel(inner_drawlist, TABLE_DRAW_CHANNEL_BG0);
    inner_drawlist->PushClipRect(table->Bg0ClipRectForDrawCmd.Min, table->Bg0ClipRectForDrawCmd.Max, false);

    // Draw inner border and resizing feedback
    ImGuiTableInstanceData* table_instance = TableGetInstanceData(table, table->InstanceCurrent);
    const float border_size = TABLE_BORDER_SIZE;
    const float draw_y1 = ImMax(table->InnerRect.Min.y, (table->FreezeRowsCount >= 1 ? table->InnerRect.Min.y : table->WorkRect.Min.y) + table->AngledHeadersHeight) + ((table->Flags & ImGuiTableFlags_BordersOuterH) ? 1.0f : 0.0f);
    const float draw_y2_body = table->InnerRect.Max.y;
    const float draw_y2_head = table->IsUsingHeaders ? ImMin(table->InnerRect.Max.y, (table->FreezeRowsCount >= 1 ? table->InnerRect.Min.y : table->WorkRect.Min.y) + table_instance->LastTopHeadersRowHeight) : draw_y1;
    if (table->Flags & ImGuiTableFlags_BordersInnerV)
    {
        for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
        {
            if (!IM_BITARRAY_TESTBIT(table->EnabledMaskByDisplayOrder, order_n))
                continue;

            const int column_n = table->DisplayOrderToIndex[order_n];
            ImGuiTableColumn* column = &table->Columns[column_n];
            const bool is_hovered = (table->HoveredColumnBorder == column_n);
            const bool is_resized = (table->ResizedColumn == column_n) && (table->InstanceInteracted == table->InstanceCurrent);
            const bool is_resizable = (column->Flags & (ImGuiTableColumnFlags_NoResize | ImGuiTableColumnFlags_NoDirectResize_)) == 0;
            const bool is_frozen_separator = (table->FreezeColumnsCount == order_n + 1);
            if (column->MaxX > table->InnerClipRect.Max.x && !is_resized)
                continue;

            // Decide whether right-most column is visible
            if (column->NextEnabledColumn == -1 && !is_resizable)
                if ((table->Flags & ImGuiTableFlags_SizingMask_) != ImGuiTableFlags_SizingFixedSame || (table->Flags & ImGuiTableFlags_NoHostExtendX))
                    continue;
            if (column->MaxX <= column->ClipRect.Min.x) // FIXME-TABLE FIXME-STYLE: Assume BorderSize==1, this is problematic if we want to increase the border size..
                continue;

            // Draw in outer window so right-most column won't be clipped
            // Always draw full height border when being resized/hovered, or on the delimitation of frozen column scrolling.
            float draw_y2 = (is_hovered || is_resized || is_frozen_separator || (table->Flags & (ImGuiTableFlags_NoBordersInBody | ImGuiTableFlags_NoBordersInBodyUntilResize)) == 0) ? draw_y2_body : draw_y2_head;
            if (draw_y2 > draw_y1)
                inner_drawlist->AddLine(ImVec2(column->MaxX, draw_y1), ImVec2(column->MaxX, draw_y2), TableGetColumnBorderCol(table, order_n, column_n), border_size);
        }
    }

    // Draw outer border
    // FIXME: could use AddRect or explicit VLine/HLine helper?
    if (table->Flags & ImGuiTableFlags_BordersOuter)
    {
        // Display outer border offset by 1 which is a simple way to display it without adding an extra draw call
        // (Without the offset, in outer_window it would be rendered behind cells, because child windows are above their
        // parent. In inner_window, it won't reach out over scrollbars. Another weird solution would be to display part
        // of it in inner window, and the part that's over scrollbars in the outer window..)
        // Either solution currently won't allow us to use a larger border size: the border would clipped.
        const ImRect outer_border = table->OuterRect;
        const ImU32 outer_col = table->BorderColorStrong;
        if ((table->Flags & ImGuiTableFlags_BordersOuter) == ImGuiTableFlags_BordersOuter)
        {
            inner_drawlist->AddRect(outer_border.Min, outer_border.Max + ImVec2(1, 1), outer_col, 0.0f, 0, border_size);
        }
        else if (table->Flags & ImGuiTableFlags_BordersOuterV)
        {
            inner_drawlist->AddLine(outer_border.Min, ImVec2(outer_border.Min.x, outer_border.Max.y), outer_col, border_size);
            inner_drawlist->AddLine(ImVec2(outer_border.Max.x, outer_border.Min.y), outer_border.Max, outer_col, border_size);
        }
        else if (table->Flags & ImGuiTableFlags_BordersOuterH)
        {
            inner_drawlist->AddLine(outer_border.Min, ImVec2(outer_border.Max.x, outer_border.Min.y), outer_col, border_size);
            inner_drawlist->AddLine(ImVec2(outer_border.Min.x, outer_border.Max.y), outer_border.Max, outer_col, border_size);
        }
    }
    if ((table->Flags & ImGuiTableFlags_BordersInnerH) && table->RowPosY2 < table->OuterRect.Max.y)
    {
        // Draw bottom-most row border between it is above outer border.
        const float border_y = table->RowPosY2;
        if (border_y >= table->BgClipRect.Min.y && border_y < table->BgClipRect.Max.y)
            inner_drawlist->AddLine(ImVec2(table->BorderX1, border_y), ImVec2(table->BorderX2, border_y), table->BorderColorLight, border_size);
    }

    inner_drawlist->PopClipRect();
}